

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *
dg::vr::RelationsAnalyzer::getFroms
          (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *__return_storage_ptr__
          ,ValueRelations *rels,V val)

{
  Value **__args;
  bool bVar1;
  bool bVar2;
  LoadInst *pLVar3;
  Handle h;
  Relations *rels_00;
  VectorSet<const_llvm::Value_*> *pVVar4;
  HandlePtr mVal;
  LoadInst *load;
  GetElementPtrInst *gep;
  LoadInst *local_78;
  _Base_bitset<1UL> local_70;
  V local_68;
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  local_60;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = val;
  pLVar3 = ValueRelations::getInstance<llvm::LoadInst>(rels,val);
  local_78 = pLVar3;
  h = ValueRelations::getHandle(rels,val);
  bVar2 = false;
  do {
    while (pLVar3 != (LoadInst *)0x0) {
      local_68 = *(V *)(pLVar3 + -0x20);
      h = ValueRelations::getHandle(rels,local_68);
      local_78 = ValueRelations::getInstance<llvm::LoadInst>(rels,local_68);
      std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
      emplace_back<llvm::Value_const*&>
                ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)
                 __return_storage_ptr__,&local_68);
      pLVar3 = local_78;
    }
    if (h == (Handle)0x0) {
      return __return_storage_ptr__;
    }
    if ((h->relatedBuckets)._M_elems[0xb].vec.
        super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (h->relatedBuckets)._M_elems[0xb].vec.
        super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return __return_storage_ptr__;
    }
    local_70._M_w = 0;
    rels_00 = Relations::pf((Relations *)&local_70);
    ValueRelations::getRelated<llvm::Value_const*>((RelationsMap *)&local_60,rels,&local_68,rels_00)
    ;
    if (local_60._M_impl.super__Rb_tree_header._M_node_count == 1) {
      h = *(Handle *)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1);
      local_78 = ValueRelations::getInstance<llvm::LoadInst>(rels,h);
      if (local_78 == (LoadInst *)0x0) {
        local_70._M_w = (_WordT)ValueRelations::getInstance<llvm::GetElementPtrInst>(rels,h);
        if ((GetElementPtrInst *)local_70._M_w == (GetElementPtrInst *)0x0) {
          pVVar4 = ValueRelations::getEqual(rels,h);
          __args = (pVVar4->vec).
                   super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (__args == (pVVar4->vec).
                        super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00133992;
          std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
          emplace_back<llvm::Value_const*const&>
                    ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)
                     __return_storage_ptr__,__args);
        }
        else {
          std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
          emplace_back<llvm::GetElementPtrInst_const*&>
                    ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)
                     __return_storage_ptr__,(GetElementPtrInst **)&local_70);
        }
      }
      else {
        std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
        emplace_back<llvm::LoadInst_const*&>
                  ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)
                   __return_storage_ptr__,&local_78);
      }
      bVar1 = true;
    }
    else {
LAB_00133992:
      bVar2 = true;
      bVar1 = false;
    }
    std::
    _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
    ::~_Rb_tree(&local_60);
    pLVar3 = local_78;
    if (!bVar1) {
      if (!bVar2) {
        std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
                  (&__return_storage_ptr__->
                    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::vector<V> RelationsAnalyzer::getFroms(const ValueRelations &rels, V val) {
    std::vector<V> result;
    const auto *load = rels.getInstance<llvm::LoadInst>(val);
    const auto *mH = rels.getHandle(val);

    while (load || (mH && rels.has(*mH, Relations::PF))) {
        if (load) {
            val = load->getPointerOperand();
            mH = rels.getHandle(val);
            load = rels.getInstance<llvm::LoadInst>(val);
            result.emplace_back(val);
        } else {
            const auto &pointedFrom = rels.getRelated(val, Relations().pf());
            if (pointedFrom.size() != 1)
                return result;
            mH = &pointedFrom.begin()->first.get();
            load = rels.getInstance<llvm::LoadInst>(*mH);
            if (load)
                result.emplace_back(load);
            else if (const auto *gep =
                             rels.getInstance<llvm::GetElementPtrInst>(*mH))
                result.emplace_back(gep);
            else {
                const auto &eqvals = rels.getEqual(*mH);
                if (eqvals.empty())
                    return result;
                result.emplace_back(*eqvals.begin());
            }
        }
    }

    return result;
}